

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O2

KFLOAT32 __thiscall KDIS::DATA_TYPE::Vector::GetDistance(Vector *this,Vector *Other)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  Vector tmp;
  DataTypeBase local_18;
  undefined8 local_10;
  float local_8;
  
  local_18._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00218190;
  uVar3 = this->m_f32X;
  uVar4 = this->m_f32Y;
  uVar1 = Other->m_f32X;
  uVar2 = Other->m_f32Y;
  fVar6 = (float)uVar3 - (float)uVar1;
  fVar7 = (float)uVar4 - (float)uVar2;
  local_10 = CONCAT44(fVar7,fVar6);
  local_8 = (float)this->m_f32Z - (float)Other->m_f32Z;
  fVar5 = local_8 * local_8;
  DataTypeBase::~DataTypeBase(&local_18);
  return (KFLOAT32)SQRT(fVar5 + fVar6 * fVar6 + fVar7 * fVar7);
}

Assistant:

KFLOAT32 Vector::GetDistance( const Vector & Other )
{
    Vector v = *this - Other;
    return v.GetMagnitude();
}